

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O1

int q_dgram_read(BIO *bio,char *dst,int bytesToRead)

{
  size_t sVar1;
  QArrayData *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  P _a;
  QLoggingCategory *pQVar5;
  void *pvVar6;
  undefined8 *__src;
  int iVar7;
  ulong __n;
  long in_FS_OFFSET;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dst == (char *)0x0 || bio == (BIO *)0x0) || bytesToRead < 1) {
    pQVar5 = lcTlsBackend();
    iVar7 = 0;
    if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      q_dgram_read_cold_1();
    }
  }
  else {
    q_BIO_clear_flags(bio,0xf);
    pvVar6 = q_BIO_get_ex_data(bio,0);
    sVar1 = *(size_t *)((long)pvVar6 + 0x40);
    if (sVar1 == 0) {
      __n = 0xffffffff;
    }
    else {
      __n = (ulong)(uint)bytesToRead;
      if ((long)sVar1 < (long)(ulong)(uint)bytesToRead) {
        __n = sVar1;
      }
      __src = *(undefined8 **)((long)pvVar6 + 0x38);
      if (__src == (undefined8 *)0x0) {
        __src = &QByteArray::_empty;
      }
      memcpy(dst,__src,__n);
      if (*(long *)((long)pvVar6 + 0x70) == 0) {
        QByteArray::mid((longlong)&local_48,(long)pvVar6 + 0x30);
        pQVar2 = *(QArrayData **)((long)pvVar6 + 0x30);
        uVar3 = *(undefined8 *)((long)pvVar6 + 0x38);
        *(QArrayData **)((long)pvVar6 + 0x30) = local_48;
        *(undefined8 *)((long)pvVar6 + 0x38) = uStack_40;
        uVar4 = *(undefined8 *)((long)pvVar6 + 0x40);
        *(undefined8 *)((long)pvVar6 + 0x40) = local_38;
        local_48 = pQVar2;
        uStack_40 = uVar3;
        local_38 = uVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,1,0x10);
          }
        }
      }
    }
    iVar7 = (int)__n;
    if (iVar7 < 1) {
      q_BIO_set_flags(bio,9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int q_dgram_read(BIO *bio, char *dst, int bytesToRead)
{
    if (!bio || !dst || bytesToRead <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    // It's us who set data, if OpenSSL does too, the logic here is wrong
    // then and we have to use BIO_set_app_data then!
    Q_ASSERT(dtls);
    int bytesRead = 0;
    if (dtls->dgram.size()) {
        bytesRead = qMin(dtls->dgram.size(), bytesToRead);
        std::memcpy(dst, dtls->dgram.constData(), bytesRead);

        if (!dtls->peeking)
            dtls->dgram = dtls->dgram.mid(bytesRead);
    } else {
        bytesRead = -1;
    }

    if (bytesRead <= 0)
        q_BIO_set_retry_read(bio);

    return bytesRead;
}